

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xml_allocator::deallocate_memory
          (xml_allocator *this,void *ptr,size_t size,xml_memory_page *page)

{
  bool bVar1;
  xml_memory_page *page_local;
  size_t size_local;
  void *ptr_local;
  xml_allocator *this_local;
  
  if (page == this->_root) {
    page->busy_size = this->_busy_size;
  }
  bVar1 = false;
  if (page + 1 <= ptr) {
    bVar1 = ptr < (void *)((long)&page[1].allocator + page->busy_size);
  }
  if (!bVar1) {
    __assert_fail("ptr >= reinterpret_cast<char*>(page) + sizeof(xml_memory_page) && ptr < reinterpret_cast<char*>(page) + sizeof(xml_memory_page) + page->busy_size"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,600,
                  "void pugi::impl::(anonymous namespace)::xml_allocator::deallocate_memory(void *, size_t, xml_memory_page *)"
                 );
  }
  page->freed_size = size + page->freed_size;
  if (page->busy_size < page->freed_size) {
    __assert_fail("page->freed_size <= page->busy_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x25c,
                  "void pugi::impl::(anonymous namespace)::xml_allocator::deallocate_memory(void *, size_t, xml_memory_page *)"
                 );
  }
  if (page->freed_size == page->busy_size) {
    if (page->next == (xml_memory_page *)0x0) {
      if (this->_root != page) {
        __assert_fail("_root == page",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                      ,0x262,
                      "void pugi::impl::(anonymous namespace)::xml_allocator::deallocate_memory(void *, size_t, xml_memory_page *)"
                     );
      }
      page->busy_size = 0;
      page->freed_size = 0;
      this->_busy_size = 0;
    }
    else {
      if (this->_root == page) {
        __assert_fail("_root != page",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                      ,0x273,
                      "void pugi::impl::(anonymous namespace)::xml_allocator::deallocate_memory(void *, size_t, xml_memory_page *)"
                     );
      }
      if (page->prev == (xml_memory_page *)0x0) {
        __assert_fail("page->prev",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                      ,0x274,
                      "void pugi::impl::(anonymous namespace)::xml_allocator::deallocate_memory(void *, size_t, xml_memory_page *)"
                     );
      }
      page->prev->next = page->next;
      page->next->prev = page->prev;
      deallocate_page(page);
    }
  }
  return;
}

Assistant:

void deallocate_memory(void* ptr, size_t size, xml_memory_page* page)
		{
			if (page == _root) page->busy_size = _busy_size;

			assert(ptr >= reinterpret_cast<char*>(page) + sizeof(xml_memory_page) && ptr < reinterpret_cast<char*>(page) + sizeof(xml_memory_page) + page->busy_size);
			(void)!ptr;

			page->freed_size += size;
			assert(page->freed_size <= page->busy_size);

			if (page->freed_size == page->busy_size)
			{
				if (page->next == 0)
				{
					assert(_root == page);

					// top page freed, just reset sizes
					page->busy_size = 0;
					page->freed_size = 0;

				#ifdef PUGIXML_COMPACT
					// reset compact state to maximize efficiency
					page->compact_string_base = 0;
					page->compact_shared_parent = 0;
					page->compact_page_marker = 0;
				#endif

					_busy_size = 0;
				}
				else
				{
					assert(_root != page);
					assert(page->prev);

					// remove from the list
					page->prev->next = page->next;
					page->next->prev = page->prev;

					// deallocate
					deallocate_page(page);
				}
			}
		}